

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

void CalculateTimeInfo(PaAlsaStream *stream,PaStreamCallbackTimeInfo *timeInfo)

{
  snd_pcm_t *psVar1;
  size_t sVar2;
  long lVar3;
  undefined1 *__s;
  undefined1 *__s_00;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  long local_50;
  snd_timestamp_t capture_timestamp;
  snd_timestamp_t playback_timestamp;
  
  uStack_60 = 0x111e86;
  sVar2 = snd_pcm_status_sizeof();
  lVar3 = -(sVar2 + 0xf & 0xfffffffffffffff0);
  __s = auStack_58 + lVar3;
  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111ea4;
  memset(__s,0,sVar2);
  *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x111ea9;
  sVar2 = snd_pcm_status_sizeof();
  __s_00 = __s + -(sVar2 + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)(__s_00 + -8) = 0x111ec7;
  memset(__s_00,0,sVar2);
  psVar1 = (stream->capture).pcm;
  if (psVar1 != (snd_pcm_t *)0x0) {
    *(undefined8 *)(__s_00 + -8) = 0x111edb;
    snd_pcm_status(psVar1,__s);
    *(undefined8 *)(__s_00 + -8) = 0x111eea;
    snd_pcm_status_get_tstamp(__s,&local_50);
    timeInfo->currentTime = (double)capture_timestamp.tv_sec / 1000000.0 + (double)local_50;
    *(undefined8 *)(__s_00 + -8) = 0x111f0f;
    lVar3 = snd_pcm_status_get_delay(__s);
    timeInfo->inputBufferAdcTime =
         timeInfo->currentTime -
         (double)lVar3 / (stream->streamRepresentation).streamInfo.sampleRate;
  }
  psVar1 = (stream->playback).pcm;
  if (psVar1 != (snd_pcm_t *)0x0) {
    *(undefined8 *)(__s_00 + -8) = 0x111f3b;
    snd_pcm_status(psVar1,__s_00);
    *(undefined8 *)(__s_00 + -8) = 0x111f47;
    snd_pcm_status_get_tstamp(__s_00,&capture_timestamp.tv_usec);
    if ((stream->capture).pcm == (snd_pcm_t *)0x0) {
      timeInfo->currentTime =
           (double)playback_timestamp.tv_sec / 1000000.0 + (double)capture_timestamp.tv_usec;
    }
    *(undefined8 *)(__s_00 + -8) = 0x111f76;
    lVar3 = snd_pcm_status_get_delay(__s_00);
    timeInfo->outputBufferDacTime =
         (double)lVar3 / (stream->streamRepresentation).streamInfo.sampleRate +
         timeInfo->currentTime;
  }
  return;
}

Assistant:

static void CalculateTimeInfo( PaAlsaStream *stream, PaStreamCallbackTimeInfo *timeInfo )
{
    snd_pcm_status_t *capture_status, *playback_status;
    snd_timestamp_t capture_timestamp, playback_timestamp;
    PaTime capture_time = 0., playback_time = 0.;

    alsa_snd_pcm_status_alloca( &capture_status );
    alsa_snd_pcm_status_alloca( &playback_status );

    if( stream->capture.pcm )
    {
        snd_pcm_sframes_t capture_delay;

        alsa_snd_pcm_status( stream->capture.pcm, capture_status );
        alsa_snd_pcm_status_get_tstamp( capture_status, &capture_timestamp );

        capture_time = capture_timestamp.tv_sec +
            ( (PaTime)capture_timestamp.tv_usec / 1000000.0 );
        timeInfo->currentTime = capture_time;

        capture_delay = alsa_snd_pcm_status_get_delay( capture_status );
        timeInfo->inputBufferAdcTime = timeInfo->currentTime -
            (PaTime)capture_delay / stream->streamRepresentation.streamInfo.sampleRate;
    }
    if( stream->playback.pcm )
    {
        snd_pcm_sframes_t playback_delay;

        alsa_snd_pcm_status( stream->playback.pcm, playback_status );
        alsa_snd_pcm_status_get_tstamp( playback_status, &playback_timestamp );

        playback_time = playback_timestamp.tv_sec +
            ((PaTime)playback_timestamp.tv_usec / 1000000.0);

        if( stream->capture.pcm ) /* Full duplex */
        {
            /* Hmm, we have both a playback and a capture timestamp.
             * Hopefully they are the same... */
            if( fabs( capture_time - playback_time ) > 0.01 )
                PA_DEBUG(( "Capture time and playback time differ by %f\n", fabs( capture_time-playback_time ) ));
        }
        else
            timeInfo->currentTime = playback_time;

        playback_delay = alsa_snd_pcm_status_get_delay( playback_status );
        timeInfo->outputBufferDacTime = timeInfo->currentTime +
            (PaTime)playback_delay / stream->streamRepresentation.streamInfo.sampleRate;
    }
}